

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_parse_der_internal
              (mbedtls_x509_crt *chain,uchar *buf,size_t buflen,int make_copy,
              mbedtls_x509_crt_ext_cb_t cb,void *p_ctx)

{
  size_t sVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  mbedtls_x509_crt *pmVar7;
  mbedtls_x509_crt *pmVar8;
  uchar *puVar9;
  int *val;
  mbedtls_asn1_sequence *pmVar10;
  mbedtls_x509_crt *crt;
  uchar *puVar11;
  size_t sVar12;
  uchar *puVar13;
  mbedtls_x509_buf local_178;
  mbedtls_x509_crt *local_158;
  uint *local_150;
  uchar *local_148;
  mbedtls_x509_sequence *local_140;
  mbedtls_asn1_sequence *local_138;
  mbedtls_asn1_sequence *local_130;
  mbedtls_x509_sequence *local_128;
  size_t local_120;
  undefined1 auStack_118 [8];
  mbedtls_x509_buf sig_params2;
  undefined1 auStack_f8 [8];
  mbedtls_x509_buf sig_params1;
  size_t local_d0;
  size_t len_1;
  mbedtls_x509_buf extn_oid;
  uint local_94;
  int *local_90;
  uchar *local_88;
  mbedtls_asn1_sequence *local_80;
  int local_74;
  size_t local_70;
  size_t len;
  uchar *local_60;
  int local_54;
  uchar *puStack_50;
  int is_critical;
  size_t local_48;
  mbedtls_x509_crt *local_40;
  uchar *local_38;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar7 = (mbedtls_x509_crt *)0x0;
  pmVar8 = chain;
  do {
    crt = pmVar8;
    local_158 = chain;
    sig_params1.p = (uchar *)p_ctx;
    if (crt->version == 0) goto LAB_001e33e7;
    pmVar7 = crt;
    pmVar8 = crt->next;
  } while (crt->next != (mbedtls_x509_crt *)0x0);
  pmVar8 = (mbedtls_x509_crt *)calloc(1,0x2f0);
  crt->next = pmVar8;
  if (pmVar8 == (mbedtls_x509_crt *)0x0) {
    return -0x2880;
  }
  memset(pmVar8,0,0x2f0);
  crt = crt->next;
LAB_001e33e7:
  auStack_f8 = (undefined1  [8])0x0;
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  auStack_118 = (undefined1  [8])0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  local_178.tag = 0;
  local_178._4_4_ = 0;
  local_178.len = 0;
  local_178.p = (uchar *)0x0;
  if (crt == (mbedtls_x509_crt *)0x0) {
    iVar3 = -0x2800;
    goto LAB_001e345d;
  }
  local_70 = buflen;
  local_40 = crt;
  local_38 = buf;
  iVar3 = mbedtls_asn1_get_tag(&local_38,buf + buflen,&local_70,0x30);
  crt = local_40;
  sVar1 = local_70;
  if (iVar3 != 0) {
    mbedtls_x509_crt_free(local_40);
    iVar3 = -0x2180;
    goto LAB_001e345d;
  }
  puVar9 = local_38 + local_70;
  sVar12 = (long)puVar9 - (long)buf;
  (local_40->raw).len = sVar12;
  if (make_copy == 0) {
    (local_40->raw).p = buf;
    local_40->own_buffer = 0;
  }
  else {
    puVar9 = (uchar *)calloc(1,sVar12);
    (local_40->raw).p = puVar9;
    if (puVar9 == (uchar *)0x0) {
      iVar3 = -0x2880;
      crt = local_40;
      goto LAB_001e345d;
    }
    memcpy(puVar9,buf,sVar12);
    local_40->own_buffer = 1;
    local_38 = puVar9 + (sVar12 - sVar1);
    puVar9 = puVar9 + sVar12;
  }
  crt = local_40;
  (local_40->tbs).p = local_38;
  iVar3 = mbedtls_asn1_get_tag(&local_38,puVar9,&local_70,0x30);
  if (iVar3 != 0) {
LAB_001e352b:
    mbedtls_x509_crt_free(crt);
    iVar3 = iVar3 + -0x2180;
LAB_001e3537:
    crt = local_40;
    if (iVar3 == 0) {
      return 0;
    }
    goto LAB_001e345d;
  }
  puVar11 = local_38 + local_70;
  (crt->tbs).len = (long)puVar11 - (long)(crt->tbs).p;
  len = (size_t)&crt->version;
  iVar3 = mbedtls_asn1_get_tag(&local_38,puVar11,&len_1,0xa0);
  if (iVar3 == 0) {
    puVar13 = local_38 + len_1;
    iVar3 = mbedtls_asn1_get_int(&local_38,puVar13,(int *)len);
    if (iVar3 != 0) {
      iVar3 = iVar3 + -0x2200;
      goto LAB_001e35d0;
    }
    if (local_38 == puVar13) goto LAB_001e35d9;
    iVar3 = -0x2266;
LAB_001e3611:
    mbedtls_x509_crt_free(local_40);
    crt = local_40;
LAB_001e345d:
    if (pmVar7 != (mbedtls_x509_crt *)0x0) {
      pmVar7->next = (mbedtls_x509_crt *)0x0;
    }
    if (crt != local_158) {
      free(crt);
    }
    return iVar3;
  }
  if (iVar3 == -0x62) {
    *(undefined4 *)len = 0;
  }
  else {
    iVar3 = iVar3 + -0x2180;
LAB_001e35d0:
    if (iVar3 != 0) goto LAB_001e3611;
  }
LAB_001e35d9:
  pmVar8 = local_40;
  iVar3 = mbedtls_x509_get_serial(&local_38,puVar11,&local_40->serial);
  if (iVar3 != 0) goto LAB_001e3611;
  iVar3 = mbedtls_x509_get_alg(&local_38,puVar11,&pmVar8->sig_oid,(mbedtls_x509_buf *)auStack_f8);
  crt = local_40;
  if (iVar3 != 0) goto LAB_001e3611;
  if (2 < *(uint *)len) {
    mbedtls_x509_crt_free(local_40);
    iVar3 = -0x2580;
    goto LAB_001e345d;
  }
  local_40->version = *(uint *)len + 1;
  local_60 = puVar11;
  iVar3 = mbedtls_x509_get_sig_alg
                    (&pmVar8->sig_oid,(mbedtls_x509_buf *)auStack_f8,&local_40->sig_md,
                     &local_40->sig_pk,&local_40->sig_opts);
  if (iVar3 != 0) {
LAB_001e3694:
    mbedtls_x509_crt_free(crt);
    goto LAB_001e345d;
  }
  (crt->issuer_raw).p = local_38;
  iVar3 = mbedtls_asn1_get_tag(&local_38,local_60,&local_70,0x30);
  if (iVar3 != 0) goto LAB_001e352b;
  iVar3 = mbedtls_x509_get_name(&local_38,local_38 + local_70,&crt->issuer);
  if (iVar3 != 0) goto LAB_001e3694;
  (crt->issuer_raw).len = (long)local_38 - (long)(crt->issuer_raw).p;
  iVar3 = mbedtls_asn1_get_tag(&local_38,local_60,&len_1,0x30);
  if (iVar3 == 0) {
    puVar11 = local_38 + len_1;
    iVar3 = mbedtls_x509_get_time(&local_38,puVar11,&local_40->valid_from);
    if (((iVar3 == 0) &&
        (iVar3 = mbedtls_x509_get_time(&local_38,puVar11,&local_40->valid_to), iVar3 == 0)) &&
       (iVar3 = -0x2466, local_38 == puVar11)) goto LAB_001e3730;
LAB_001e3815:
    crt = local_40;
    mbedtls_x509_crt_free(local_40);
    goto LAB_001e345d;
  }
  iVar3 = iVar3 + -0x2400;
  if (iVar3 != 0) goto LAB_001e3815;
LAB_001e3730:
  (local_40->subject_raw).p = local_38;
  iVar3 = mbedtls_asn1_get_tag(&local_38,local_60,&local_70,0x30);
  crt = local_40;
  if (iVar3 != 0) goto LAB_001e352b;
  if ((local_70 != 0) &&
     (iVar3 = mbedtls_x509_get_name(&local_38,local_38 + local_70,&local_40->subject), iVar3 != 0))
  goto LAB_001e3815;
  (local_40->subject_raw).len = (long)local_38 - (long)(local_40->subject_raw).p;
  (local_40->pk_raw).p = local_38;
  iVar3 = mbedtls_pk_parse_subpubkey(&local_38,local_60,&local_40->pk);
  if (iVar3 != 0) goto LAB_001e3815;
  (local_40->pk_raw).len = (long)local_38 - (long)(local_40->pk_raw).p;
  uVar4 = local_40->version;
  if ((uVar4 & 0xfffffffe) == 2) {
    iVar3 = x509_get_uid(&local_38,local_60,&local_40->issuer_id,1);
    if (iVar3 != 0) goto LAB_001e389f;
    uVar4 = *(uint *)len;
  }
  if ((uVar4 & 0xfffffffe) != 2) {
LAB_001e406e:
    if (local_38 != local_60) {
LAB_001e4078:
      crt = local_40;
      mbedtls_x509_crt_free(local_40);
      iVar3 = -0x21e6;
      goto LAB_001e345d;
    }
    iVar3 = mbedtls_x509_get_alg(&local_38,puVar9,&local_178,(mbedtls_x509_buf *)auStack_118);
    if (iVar3 == 0) {
      sVar12 = (local_40->sig_oid).len;
      if ((sVar12 == local_178.len) &&
         (iVar3 = bcmp((local_40->sig_oid).p,local_178.p,sVar12), iVar3 == 0)) {
        if (((auStack_f8._0_4_ == auStack_118._0_4_) && (sig_params1._0_8_ == sig_params2._0_8_)) &&
           ((sig_params1._0_8_ == 0 ||
            (iVar3 = bcmp((void *)sig_params1.len,(void *)sig_params2.len,sig_params1._0_8_),
            iVar3 == 0)))) {
          iVar3 = mbedtls_x509_get_sig(&local_38,puVar9,&local_40->sig);
          if (iVar3 == 0) {
            if (local_38 == puVar9) {
              return 0;
            }
            goto LAB_001e4078;
          }
          goto LAB_001e3815;
        }
      }
      crt = local_40;
      mbedtls_x509_crt_free(local_40);
      iVar3 = -0x2680;
      goto LAB_001e345d;
    }
    goto LAB_001e3815;
  }
  iVar3 = x509_get_uid(&local_38,local_60,&local_40->subject_id,2);
  if (iVar3 != 0) {
LAB_001e389f:
    mbedtls_x509_crt_free(local_40);
    goto LAB_001e3537;
  }
  if ((*(int *)len != 3) || (local_38 == local_60)) goto LAB_001e406e;
  iVar3 = mbedtls_x509_get_ext(&local_38,local_60,&local_40->v3_ext,3);
  if (iVar3 != 0) goto LAB_001e389f;
  len = (size_t)((local_40->v3_ext).p + (local_40->v3_ext).len);
  local_130 = &local_40->certificate_policies;
  local_148 = &local_40->ns_cert_type;
  local_140 = &local_40->subject_alt_names;
  local_128 = &(local_40->authority_key_id).authorityCertIssuer;
  local_138 = &local_40->ext_key_usage;
  local_150 = &local_40->key_usage;
  local_90 = &local_40->ca_istrue;
  val = &local_40->max_pathlen;
LAB_001e396f:
  if (len <= local_38) {
    iVar3 = -0x2566;
    if (local_38 != (uchar *)len) goto LAB_001e389f;
    goto LAB_001e406e;
  }
  extn_oid.len = 0;
  local_54 = 0;
  len_1 = 0;
  extn_oid.tag = 0;
  extn_oid._4_4_ = 0;
  local_94 = 0;
  iVar3 = mbedtls_asn1_get_tag(&local_38,(uchar *)len,&local_d0,0x30);
  if (iVar3 != 0) {
LAB_001e4050:
    iVar3 = iVar3 + -0x2500;
    goto LAB_001e4055;
  }
  puVar11 = local_38 + local_d0;
  iVar3 = mbedtls_asn1_get_tag(&local_38,puVar11,(size_t *)&extn_oid,6);
  if (iVar3 != 0) goto LAB_001e4050;
  len_1 = CONCAT44(len_1._4_4_,6);
  extn_oid.len = (size_t)local_38;
  local_38 = local_38 + extn_oid._0_8_;
  iVar3 = mbedtls_asn1_get_bool(&local_38,puVar11,&local_54);
  if (((iVar3 != -0x62) && (iVar3 != 0)) ||
     (iVar3 = mbedtls_asn1_get_tag(&local_38,puVar11,&local_d0,4), puVar13 = local_38, iVar3 != 0))
  goto LAB_001e4050;
  puStack_50 = local_38 + local_d0;
  iVar6 = -0x2566;
  iVar3 = iVar6;
  if (puStack_50 != puVar11) goto LAB_001e389f;
  iVar5 = mbedtls_oid_get_x509_ext_type((mbedtls_asn1_buf *)&len_1,(int *)&local_94);
  if (iVar5 != 0) {
    if (cb == (mbedtls_x509_crt_ext_cb_t)0x0) goto LAB_001e3bfe;
    iVar3 = (*cb)(sig_params1.p,local_40,(mbedtls_x509_buf *)&len_1,local_54,local_38,puStack_50);
    if ((iVar3 != 0) && (local_54 != 0)) goto LAB_001e389f;
LAB_001e3ab7:
    local_38 = puStack_50;
    goto LAB_001e396f;
  }
  if ((local_94 & local_40->ext_types) != 0) {
    iVar3 = -0x2500;
    goto LAB_001e389f;
  }
  local_40->ext_types = local_40->ext_types | local_94;
  switch(local_94) {
  case 1:
    local_48 = 0;
    iVar5 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x30);
    if (iVar5 != 0) goto LAB_001e3d82;
    if (local_38 + local_48 != puVar11) goto LAB_001e389f;
    iVar5 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x80);
    if (iVar5 == 0) {
      (local_40->authority_key_id).keyIdentifier.len = local_48;
      (local_40->authority_key_id).keyIdentifier.p = local_38;
      (local_40->authority_key_id).keyIdentifier.tag = 4;
      local_38 = local_38 + local_48;
    }
    else if (iVar5 != -0x62) goto LAB_001e3d82;
    if (puVar11 <= local_38) {
joined_r0x001e3ce4:
      iVar3 = iVar6;
      if (local_38 != puVar11) goto LAB_001e389f;
      goto LAB_001e396f;
    }
    iVar5 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0xa1);
    if (iVar5 == 0) {
      iVar3 = mbedtls_x509_get_subject_alt_name_ext(&local_38,local_38 + local_48,local_128);
      if (iVar3 != 0) goto LAB_001e389f;
      iVar5 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x82);
      if (iVar5 == 0) {
        (local_40->authority_key_id).authorityCertSerialNumber.len = local_48;
        (local_40->authority_key_id).authorityCertSerialNumber.p = local_38;
        (local_40->authority_key_id).authorityCertSerialNumber.tag = 2;
        local_38 = local_38 + local_48;
        goto joined_r0x001e3ce4;
      }
    }
    goto LAB_001e3d82;
  case 2:
    local_48 = 0;
    iVar5 = mbedtls_asn1_get_tag(&local_38,puVar11,&local_48,4);
    if (iVar5 == 0) {
      (local_40->subject_key_id).len = local_48;
      (local_40->subject_key_id).tag = 4;
      (local_40->subject_key_id).p = local_38;
      local_38 = local_38 + local_48;
      goto joined_r0x001e3ce4;
    }
LAB_001e3d82:
    iVar3 = iVar5 + -0x2500;
    if (iVar3 != 0) {
LAB_001e4055:
      if (iVar3 == 0) goto LAB_001e406e;
      goto LAB_001e389f;
    }
    goto LAB_001e396f;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_001e3c23_caseD_3:
    if (local_54 == 0) goto LAB_001e3ab7;
    iVar3 = -0x2080;
    goto LAB_001e389f;
  case 4:
    iVar6 = mbedtls_x509_get_key_usage(&local_38,puStack_50,local_150);
    iVar5 = iVar6;
    break;
  case 8:
    iVar6 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x30);
    if (iVar6 == 0) {
      local_74 = -0x2566;
      iVar3 = local_74;
      if ((local_48 == 0) || (local_88 = local_38, local_38 + local_48 != puVar11))
      goto LAB_001e389f;
      iVar6 = 0;
      local_80 = local_130;
      while (local_88 < puVar11) {
        iVar3 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x30);
        if (iVar3 != 0) {
LAB_001e3f05:
          iVar6 = iVar3 + -0x2500;
          goto LAB_001e3fee;
        }
        local_88 = local_38 + local_48;
        iVar3 = mbedtls_asn1_get_tag(&local_38,local_88,&local_48,6);
        puVar2 = local_38;
        if (iVar3 != 0) goto LAB_001e3f05;
        local_120 = local_48;
        if ((local_48 != 4) || (iVar3 = bcmp("U\x1d ",local_38,4), iVar3 != 0)) {
          iVar6 = -0x2080;
        }
        if ((local_80->buf).p != (uchar *)0x0) {
          if (local_80->next != (mbedtls_asn1_sequence *)0x0) {
            local_74 = -0x2500;
            iVar3 = local_74;
            goto LAB_001e389f;
          }
          pmVar10 = (mbedtls_asn1_sequence *)calloc(1,0x20);
          local_80->next = pmVar10;
          local_80 = pmVar10;
          if (pmVar10 == (mbedtls_x509_sequence *)0x0) {
            local_74 = -0x256a;
            iVar3 = local_74;
            goto LAB_001e389f;
          }
        }
        (local_80->buf).tag = 6;
        (local_80->buf).p = puVar2;
        (local_80->buf).len = local_120;
        local_38 = puVar2 + local_120;
        if (local_38 < local_88) {
          iVar3 = mbedtls_asn1_get_tag(&local_38,local_88,&local_48,0x30);
          if (iVar3 != 0) goto LAB_001e3f05;
          local_38 = local_38 + local_48;
        }
        iVar3 = local_74;
        if (local_38 != local_88) goto LAB_001e389f;
      }
      local_80->next = (mbedtls_asn1_sequence *)0x0;
      iVar3 = local_74;
      if (local_88 != puVar11) goto LAB_001e389f;
    }
    else {
      iVar6 = iVar6 + -0x2500;
    }
LAB_001e3fee:
    if ((iVar6 == 0) ||
       (((cb != (mbedtls_x509_crt_ext_cb_t)0x0 && (iVar6 == -0x2080)) &&
        (iVar3 = (*cb)(sig_params1.p,local_40,(mbedtls_x509_buf *)&len_1,local_54,puVar13,puStack_50
                      ), iVar3 == 0)))) goto LAB_001e396f;
    iVar3 = iVar6;
    iVar5 = local_54;
    if (iVar6 != -0x2080) goto LAB_001e389f;
    break;
  default:
    if (local_94 == 0x20) {
      iVar6 = mbedtls_x509_get_subject_alt_name(&local_38,puStack_50,local_140);
      iVar5 = iVar6;
    }
    else {
      if (local_94 != 0x10000) {
        if (local_94 == 0x800) {
          iVar5 = mbedtls_asn1_get_sequence_of(&local_38,puStack_50,local_138,6);
          if (iVar5 != 0) goto LAB_001e3d82;
          if ((local_40->ext_key_usage).buf.p == (uchar *)0x0) {
LAB_001e4199:
            iVar3 = -0x2564;
            goto LAB_001e389f;
          }
          goto LAB_001e396f;
        }
        if (local_94 != 0x100) goto switchD_001e3c23_caseD_3;
        *local_90 = 0;
        *val = 0;
        iVar5 = mbedtls_asn1_get_tag(&local_38,puStack_50,&local_48,0x30);
        if (iVar5 != 0) goto LAB_001e3d82;
        if (local_38 == puVar11) goto LAB_001e396f;
        iVar5 = mbedtls_asn1_get_bool(&local_38,puStack_50,local_90);
        if (iVar5 != 0) {
          if (iVar5 == -0x62) {
            iVar5 = mbedtls_asn1_get_int(&local_38,puStack_50,local_90);
          }
          if (iVar5 != 0) goto LAB_001e3d82;
          if (*local_90 != 0) {
            *local_90 = 1;
          }
        }
        if (local_38 == puVar11) goto LAB_001e396f;
        iVar5 = mbedtls_asn1_get_int(&local_38,puStack_50,val);
        if (iVar5 == 0) {
          if (local_38 != puVar11) goto LAB_001e389f;
          if (*val == 0x7fffffff) goto LAB_001e4199;
          *val = *val + 1;
          goto LAB_001e396f;
        }
        goto LAB_001e3d82;
      }
      iVar6 = mbedtls_x509_get_ns_cert_type(&local_38,puStack_50,local_148);
      iVar5 = iVar6;
    }
  }
  iVar3 = iVar6;
  if (iVar5 != 0) goto LAB_001e389f;
  goto LAB_001e396f;
LAB_001e3bfe:
  local_38 = puStack_50;
  if (local_54 != 0) goto LAB_001e416a;
  goto LAB_001e396f;
LAB_001e416a:
  iVar3 = -0x2562;
  goto LAB_001e389f;
}

Assistant:

static int mbedtls_x509_crt_parse_der_internal(mbedtls_x509_crt *chain,
                                               const unsigned char *buf,
                                               size_t buflen,
                                               int make_copy,
                                               mbedtls_x509_crt_ext_cb_t cb,
                                               void *p_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if (crt == NULL || buf == NULL) {
        return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
    }

    while (crt->version != 0 && crt->next != NULL) {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if (crt->version != 0 && crt->next == NULL) {
        crt->next = mbedtls_calloc(1, sizeof(mbedtls_x509_crt));

        if (crt->next == NULL) {
            return MBEDTLS_ERR_X509_ALLOC_FAILED;
        }

        prev = crt;
        mbedtls_x509_crt_init(crt->next);
        crt = crt->next;
    }

    ret = x509_crt_parse_der_core(crt, buf, buflen, make_copy, cb, p_ctx);
    if (ret != 0) {
        if (prev) {
            prev->next = NULL;
        }

        if (crt != chain) {
            mbedtls_free(crt);
        }

        return ret;
    }

    return 0;
}